

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O2

void __thiscall FM::OPNABase::DataLoad(OPNABase *this,OPNABaseData *data)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint32 uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint8 *__dest;
  long lVar9;
  Channel4 *this_00;
  
  OPNBase::DataLoad(&this->super_OPNBase,&data->opnbase);
  *(undefined2 *)(this->pan + 4) = *(undefined2 *)(data->pan + 4);
  *(undefined4 *)this->pan = *(undefined4 *)data->pan;
  *(undefined4 *)(this->panvolume_l + 4) = *(undefined4 *)(data->panvolume_l + 4);
  *(undefined8 *)this->panvolume_l = *(undefined8 *)data->panvolume_l;
  *(undefined4 *)(this->panvolume_r + 4) = *(undefined4 *)(data->panvolume_r + 4);
  *(undefined8 *)this->panvolume_r = *(undefined8 *)data->panvolume_r;
  *(undefined8 *)this->fnum2 = *(undefined8 *)data->fnum2;
  this->fnum2[8] = data->fnum2[8];
  this->reg22 = data->reg22;
  uVar2 = data->stmask;
  uVar3 = data->statusnext;
  uVar4 = data->lfocount;
  this->reg29 = data->reg29;
  this->stmask = uVar2;
  this->statusnext = uVar3;
  this->lfocount = uVar4;
  this->lfodcount = data->lfodcount;
  *(undefined8 *)(this->fnum + 4) = *(undefined8 *)(data->fnum + 4);
  uVar1 = *(undefined8 *)(data->fnum + 2);
  *(undefined8 *)this->fnum = *(undefined8 *)data->fnum;
  *(undefined8 *)(this->fnum + 2) = uVar1;
  this->fnum3[2] = data->fnum3[2];
  *(undefined8 *)this->fnum3 = *(undefined8 *)data->fnum3;
  if (data->is_adpcmbuf == true) {
    __dest = this->adpcmbuf;
    if (__dest == (uint8 *)0x0) {
      __dest = (uint8 *)operator_new__(0x40000);
      this->adpcmbuf = __dest;
    }
    memcpy(__dest,data->adpcmbuf,0x40000);
  }
  uVar2 = data->adpcmnotice;
  uVar3 = data->startaddr;
  uVar5 = data->stopaddr;
  this->adpcmmask = data->adpcmmask;
  this->adpcmnotice = uVar2;
  this->startaddr = uVar3;
  this->stopaddr = uVar5;
  uVar2 = data->limitaddr;
  iVar6 = data->adpcmlevel;
  iVar7 = data->adpcmvolume;
  this->memaddr = data->memaddr;
  this->limitaddr = uVar2;
  this->adpcmlevel = iVar6;
  this->adpcmvolume = iVar7;
  uVar2 = data->deltan;
  iVar6 = data->adplc;
  iVar7 = data->adpld;
  this->adpcmvol = data->adpcmvol;
  this->deltan = uVar2;
  this->adplc = iVar6;
  this->adpld = iVar7;
  iVar6 = data->adpcmx;
  iVar7 = data->adpcmd;
  iVar8 = data->adpcmout;
  this->adplbase = data->adplbase;
  this->adpcmx = iVar6;
  this->adpcmd = iVar7;
  this->adpcmout = iVar8;
  iVar6 = data->apout1;
  this->apout0 = data->apout0;
  this->apout1 = iVar6;
  this->adpcmreadbuf = data->adpcmreadbuf;
  this->adpcmplay = data->adpcmplay;
  this->granuality = data->granuality;
  this->control1 = data->control1;
  this->control2 = data->control2;
  *(undefined8 *)this->adpcmreg = *(undefined8 *)data->adpcmreg;
  this->rhythmmask_ = data->rhythmmask_;
  this_00 = (Channel4 *)&this->field_0x280;
  for (lVar9 = 0; lVar9 != 0xd50; lVar9 = lVar9 + 0x238) {
    Channel4::DataLoad(this_00,(Channel4Data *)((long)data->ch[0].buf + lVar9 + -4));
    Channel4::SetChip(this_00,&(this->super_OPNBase).chip);
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

void OPNABase::DataLoad(struct OPNABaseData* data) {
	OPNBase::DataLoad(&data->opnbase);
	memcpy(pan, data->pan, 6);
	memcpy(panvolume_l, data->panvolume_l, sizeof(uint16) * 6);
	memcpy(panvolume_r, data->panvolume_r, sizeof(uint16) * 6);
	memcpy(fnum2, data->fnum2, 9);
	reg22 = data->reg22;
	reg29 = data->reg29;
	stmask = data->stmask;
	statusnext = data->statusnext;
	lfocount = data->lfocount;
	lfodcount = data->lfodcount;
	memcpy(fnum, data->fnum, sizeof(uint) * 6);
	memcpy(fnum3, data->fnum3, sizeof(uint) * 3);
	if(data->is_adpcmbuf) {
		if(!adpcmbuf)
			adpcmbuf = new uint8[0x40000];
		memcpy(adpcmbuf, data->adpcmbuf, 0x40000);
	}
	adpcmmask = data->adpcmmask;
	adpcmnotice = data->adpcmnotice;
	startaddr = data->startaddr;
	stopaddr = data->stopaddr;
	memaddr = data->memaddr;
	limitaddr = data->limitaddr;
	adpcmlevel = data->adpcmlevel;
	adpcmvolume = data->adpcmvolume;
	adpcmvol = data->adpcmvol;
	deltan = data->deltan;
	adplc = data->adplc;
	adpld = data->adpld;
	adplbase = data->adplbase;
	adpcmx = data->adpcmx;
	adpcmd = data->adpcmd;
	adpcmout = data->adpcmout;
	apout0 = data->apout0;
	apout1 = data->apout1;
	adpcmreadbuf = data->adpcmreadbuf;
	adpcmplay = data->adpcmplay;
	granuality = data->granuality;
	control1 = data->control1;
	control2 = data->control2;
	memcpy(adpcmreg, data->adpcmreg, 8);
	rhythmmask_ = data->rhythmmask_;
	for(int i = 0; i < 6; i++) {
		ch[i].DataLoad(&data->ch[i]);
		ch[i].SetChip(&chip);
	}
}